

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O1

Lazy<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_> __thiscall
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::reconnect_impl
          (client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *this,
          unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
          *client,shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                  *self)

{
  element_type *peVar1;
  
  peVar1 = (element_type *)operator_new(0x98,(nothrow_t *)&std::nothrow);
  if (peVar1 == (element_type *)0x0) {
    (this->
    super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
    )._M_weak_this.
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
  }
  else {
    *(code **)&(peVar1->
               super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
               )._M_weak_this.
               super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
         = reconnect_impl;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar1->
            super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
            )._M_weak_this.
            super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    + 8))->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)reconnect_impl;
    *(shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> **)
     ((long)&(peVar1->free_clients_).queue_[0].initialImplicitProducerHashEntries + 0x18) = self;
    (((ImplicitProducerKVP *)
     ((long)&(peVar1->free_clients_).queue_[0].initialImplicitProducerHashEntries + 0x10))->key).
    super___atomic_base<unsigned_long>._M_i = (__int_type)client;
    (peVar1->free_clients_).queue_[0].producerListTail._M_b = (__base_type)0x0;
    *(undefined8 *)&(peVar1->free_clients_).queue_[0].producerCount = 0;
    (peVar1->free_clients_).queue_[0].initialBlockPoolIndex.super___atomic_base<unsigned_long>._M_i
         = 0;
    *(undefined1 *)&(peVar1->free_clients_).queue_[0].freeList.freeListHead._M_b._M_p = 0;
    (this->
    super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
    )._M_weak_this.
    super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar1;
    *(undefined1 *)
     ((long)&(peVar1->free_clients_).queue_[0].initialImplicitProducerHashEntries + 0x28) = 0;
  }
  return (LazyBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_false>)
         (LazyBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_false>)
         this;
}

Assistant:

static async_simple::coro::Lazy<std::pair<bool, std::chrono::milliseconds>>
  reconnect_impl(std::unique_ptr<client_t>& client,
                 std::shared_ptr<client_pool>& self) {
    auto pre_time_point = std::chrono::steady_clock::now();
    auto result = co_await client->connect(self->host_name_);
    bool ok = client_t::is_ok(result);
    auto post_time_point = std::chrono::steady_clock::now();
    auto cost_time = std::chrono::duration_cast<std::chrono::milliseconds>(
        post_time_point - pre_time_point);
    CINATRA_LOG_TRACE << "reconnect client{" << client.get() << "} cost time: "
                      << cost_time / std::chrono::milliseconds{1} << "ms";
    co_return std::pair{ok, cost_time};
  }